

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngfix.c
# Opt level: O0

int zlib_run(zlib *zlib)

{
  IDAT_list *pIVar1;
  chunk *pcVar2;
  int iVar3;
  int rc_1;
  chunk *chunk;
  int jcount;
  int j;
  IDAT_list *check;
  int rc;
  uint i;
  uint count;
  int skip;
  IDAT_list *last;
  IDAT_list *list;
  zlib *zlib_local;
  
  zlib->extra_bytes = 0;
  if (zlib->idat == (IDAT *)0x0) {
    pcVar2 = zlib->chunk;
    if (zlib->rewrite_offset < pcVar2->chunk_length) {
      iVar3 = zlib_advance(zlib,pcVar2->chunk_length - zlib->rewrite_offset);
      pcVar2->chunk_length = pcVar2->chunk_length - zlib->extra_bytes;
      return iVar3;
    }
    __assert_fail("zlib->rewrite_offset < chunk->chunk_length",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                  ,0xa16,"int zlib_run(struct zlib *)");
  }
  last = zlib->idat->idat_list_head;
  pIVar1 = zlib->idat->idat_list_tail;
  i = 0;
  if (zlib->rewrite_offset != 0) {
    __assert_fail("zlib->rewrite_offset == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctruta[P]libpng/contrib/tools/pngfix.c"
                  ,0x9c4,"int zlib_run(struct zlib *)");
  }
  do {
    chunk._0_4_ = last->count;
    for (check._4_4_ = 0; check._4_4_ < (uint)chunk; check._4_4_ = check._4_4_ + 1) {
      if (i != 0) {
        skip_12(zlib->file);
      }
      i = 0xc;
      iVar3 = zlib_advance(zlib,last->lengths[check._4_4_]);
      if (iVar3 != 0) {
        if (iVar3 != 1) {
          return iVar3;
        }
        if (((undefined1  [96])((undefined1  [96])*zlib->global & (undefined1  [96])0x1) ==
             (undefined1  [96])0x0) || (zlib->extra_bytes != 0)) goto LAB_0010712f;
        _jcount = last;
        chunk._4_4_ = check._4_4_ + 1;
        goto LAB_001070c7;
      }
    }
    if (last == pIVar1) {
      return 0;
    }
    last = last->next;
  } while( true );
LAB_001070c7:
  if (chunk._4_4_ < (int)(uint)chunk) {
    if (_jcount->lengths[chunk._4_4_] != 0) {
      chunk_message(zlib->chunk,"extra compressed data");
LAB_0010712f:
      last->lengths[check._4_4_] = last->lengths[check._4_4_] - zlib->extra_bytes;
      last->count = check._4_4_ + 1;
      zlib->idat->idat_list_tail = last;
      return 1;
    }
    chunk._4_4_ = chunk._4_4_ + 1;
    goto LAB_001070c7;
  }
  if (_jcount == pIVar1) goto LAB_0010712f;
  _jcount = _jcount->next;
  chunk._0_4_ = _jcount->count;
  chunk._4_4_ = 0;
  goto LAB_001070c7;
}

Assistant:

static int
zlib_run(struct zlib *zlib)
   /* Like zlib_advance but also handles a stream of IDAT chunks. */
{
   /* The 'extra_bytes' field is set by zlib_advance if there is extra
    * compressed data in the chunk it handles (if it sees Z_STREAM_END before
    * all the input data has been used.)  This function uses the value to update
    * the correct chunk length, so the problem should only ever be detected once
    * for each chunk.  zlib_advance outputs the error message, though see the
    * IDAT specific check below.
    */
   zlib->extra_bytes = 0;

   if (zlib->idat != NULL)
   {
      struct IDAT_list *list = zlib->idat->idat_list_head;
      struct IDAT_list *last = zlib->idat->idat_list_tail;
      int        skip = 0;

      /* 'rewrite_offset' is the offset of the LZ data within the chunk, for
       * IDAT it should be 0:
       */
      assert(zlib->rewrite_offset == 0);

      /* Process each IDAT_list in turn; the caller has left the stream
       * positioned at the start of the first IDAT chunk data.
       */
      for (;;)
      {
         unsigned int count = list->count;
         unsigned int i;

         for (i = 0; i<count; ++i)
         {
            int rc;

            if (skip > 0) /* Skip CRC and next IDAT header */
               skip_12(zlib->file);

            skip = 12; /* for the next time */

            rc = zlib_advance(zlib, list->lengths[i]);

            switch (rc)
            {
               case ZLIB_OK: /* keep going */
                  break;

               case ZLIB_STREAM_END: /* stop */
                  /* There may be extra chunks; if there are and one of them is
                   * not zero length output the 'extra data' message.  Only do
                   * this check if errors are being output.
                   */
                  if (zlib->global->errors && zlib->extra_bytes == 0)
                  {
                     struct IDAT_list *check = list;
                     int j = i+1, jcount = count;

                     for (;;)
                     {
                        for (; j<jcount; ++j)
                           if (check->lengths[j] > 0)
                           {
                              chunk_message(zlib->chunk,
                                 "extra compressed data");
                              goto end_check;
                           }

                        if (check == last)
                           break;

                        check = check->next;
                        jcount = check->count;
                        j = 0;
                     }
                  }

               end_check:
                  /* Terminate the list at the current position, reducing the
                   * length of the last IDAT too if required.
                   */
                  list->lengths[i] -= zlib->extra_bytes;
                  list->count = i+1;
                  zlib->idat->idat_list_tail = list;
                  /* FALLTHROUGH */

               default:
                  return rc;
            }
         }

         /* At the end of the compressed data and Z_STREAM_END was not seen. */
         if (list == last)
            return ZLIB_OK;

         list = list->next;
      }
   }

   else
   {
      struct chunk *chunk = zlib->chunk;
      int rc;

      assert(zlib->rewrite_offset < chunk->chunk_length);

      rc = zlib_advance(zlib, chunk->chunk_length - zlib->rewrite_offset);

      /* The extra bytes in the chunk are handled now by adjusting the chunk
       * length to exclude them; the zlib data is always stored at the end of
       * the PNG chunk (although clearly this is not necessary.)  zlib_advance
       * has already output a warning message.
       */
      chunk->chunk_length -= zlib->extra_bytes;
      return rc;
   }
}